

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

opj_bool opj_encode_with_info
                   (opj_cinfo_t *cinfo,opj_cio_t *cio,opj_image_t *image,
                   opj_codestream_info_t *cstr_info)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  opj_codestream_info_t *in_stack_00000008;
  opj_codestream_info_t *in_stack_00000050;
  opj_image_t *in_stack_00000058;
  opj_cio_t *in_stack_00000060;
  opj_jp2_t *in_stack_00000068;
  opj_bool local_4;
  
  if (((in_RDI == 0) || (in_RSI == 0)) || (in_RDX == 0)) goto switchD_002a8f8d_default;
  switch(*(undefined4 *)(in_RDI + 0x14)) {
  case 0:
    local_4 = j2k_encode((opj_j2k_t *)cio,(opj_cio_t *)image,(opj_image_t *)cstr_info,
                         in_stack_00000008);
    break;
  case 2:
    local_4 = opj_jp2_encode(in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050
                            );
    break;
  case 0xffffffff:
  case 1:
  default:
switchD_002a8f8d_default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

opj_bool OPJ_CALLCONV opj_encode_with_info(opj_cinfo_t *cinfo, opj_cio_t *cio, opj_image_t *image, opj_codestream_info_t *cstr_info) {
	if(cinfo && cio && image) {
		switch(cinfo->codec_format) {
			case CODEC_J2K:
				return j2k_encode((opj_j2k_t*)cinfo->j2k_handle, cio, image, cstr_info);
			case CODEC_JP2:
				return opj_jp2_encode((opj_jp2_t*)cinfo->jp2_handle, cio, image, cstr_info);	    
			case CODEC_JPT:
			case CODEC_UNKNOWN:
			default:
				break;
		}
	}
	return OPJ_FALSE;
}